

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O3

void __thiscall tl::StrT<char>::eraseRange(StrT<char> *this,u32 from,u32 to)

{
  uint uVar1;
  u32 i;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)from;
  if ((from < to || from - to == 0) && (uVar1 = this->_size, to <= uVar1)) {
    if (to < uVar1) {
      uVar3 = (ulong)to;
      do {
        this->_str[uVar2] = this->_str[uVar3];
        uVar2 = (ulong)((int)uVar2 + 1);
        uVar3 = uVar3 + 1;
      } while ((uint)uVar3 < uVar1);
    }
    resize(this,(from - to) + uVar1);
    return;
  }
  __assert_fail("from <= to && to <= _size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/str.cpp"
                ,299,"void tl::StrT<char>::eraseRange(u32, u32) [CharT = char]");
}

Assistant:

void StrT<CharT>::eraseRange(u32 from, u32 to)
{
    const u32 prevSize = _size;
    assert(from <= to && to <= _size);

    const u32 nToDel = to - from;
    for(u32 i = from; i + nToDel < prevSize; i++) {
        _str[i] = _str[i + nToDel];
    }
    resize(prevSize - nToDel);
}